

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

int __thiscall ncnn::Convolution::forward(Convolution *this,Mat *bottom_blob,Mat *top_blob)

{
  bool bVar1;
  float *pfVar2;
  undefined8 in_RDX;
  Mat *in_RSI;
  long in_RDI;
  float w_1;
  float val;
  int k;
  float *sptr;
  Mat m;
  int q;
  float *kptr;
  float sum;
  int j_1;
  int i_1;
  float *outptr;
  int p;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh;
  int outw;
  int hpad;
  int wpad;
  Mat bottom_blob_bordered;
  int kernel_extent_h;
  int kernel_extent_w;
  int channels;
  int h;
  int w;
  Mat weights [2];
  ParamDict pd;
  Layer *op;
  int num_input;
  undefined4 in_stack_fffffffffffff8d8;
  int in_stack_fffffffffffff8dc;
  undefined4 in_stack_fffffffffffff8e0;
  int in_stack_fffffffffffff8e4;
  Mat *in_stack_fffffffffffff8e8;
  allocator_type *in_stack_fffffffffffff8f0;
  size_type in_stack_fffffffffffff8f8;
  Mat *in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff920;
  undefined4 in_stack_fffffffffffff924;
  float in_stack_fffffffffffff954;
  undefined8 in_stack_fffffffffffff958;
  Mat *pMVar3;
  int left;
  undefined8 in_stack_fffffffffffff960;
  Mat *pMVar4;
  int top;
  Mat *in_stack_fffffffffffff968;
  Mat *in_stack_fffffffffffff970;
  Layer *pLVar5;
  int in_stack_fffffffffffff980;
  Mat *local_670;
  int local_64c;
  Mat local_640;
  int local_60c;
  allocator_type *local_608;
  float local_5fc;
  int local_5f8;
  int local_5f4;
  Mat local_5f0;
  float *local_5c0;
  int local_5b8;
  int local_5b4;
  int local_5b0;
  int local_5ac;
  int local_5a8;
  int local_5a4;
  reference local_5a0;
  vector<int,_std::allocator<int>_> local_590;
  int local_578;
  int local_574;
  int local_570;
  int local_56c;
  int local_568;
  undefined4 local_564;
  Mat local_560;
  int local_52c;
  int local_528;
  int local_524;
  int local_520;
  int local_51c;
  undefined1 local_518 [16];
  Mat local_508 [2];
  undefined1 auStack_4a8 [1144];
  Layer *local_30;
  int local_24;
  undefined8 local_20;
  Mat *local_18;
  int local_4;
  
  if ((((in_RSI->dims == 1) && (*(int *)(in_RDI + 0x84) == 1)) && (*(int *)(in_RDI + 0x88) == 1)) &&
     (local_24 = *(int *)(in_RDI + 0xa8) / *(int *)(in_RDI + 0x80), in_RSI->w == local_24)) {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_30 = create_layer(in_stack_fffffffffffff8dc);
    ParamDict::ParamDict((ParamDict *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920))
    ;
    ParamDict::set((ParamDict *)(auStack_4a8 + 0x18),0,*(int *)(in_RDI + 0x80));
    ParamDict::set((ParamDict *)(auStack_4a8 + 0x18),1,*(int *)(in_RDI + 0xa4));
    ParamDict::set((ParamDict *)(auStack_4a8 + 0x18),2,*(int *)(in_RDI + 0xa8));
    (*local_30->_vptr_Layer[2])(local_30,auStack_4a8 + 0x18);
    local_670 = local_508;
    do {
      Mat::Mat(local_670);
      local_670 = local_670 + 1;
    } while (local_670 != (Mat *)auStack_4a8);
    Mat::operator=(in_stack_fffffffffffff8e8,
                   (Mat *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    Mat::operator=(in_stack_fffffffffffff8e8,
                   (Mat *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    pLVar5 = local_30;
    ModelBinFromMatArray::ModelBinFromMatArray
              ((ModelBinFromMatArray *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0)
               ,(Mat *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
    (*pLVar5->_vptr_Layer[3])(pLVar5,local_518);
    (*local_30->_vptr_Layer[5])(local_30,local_18,local_20);
    if (local_30 != (Layer *)0x0) {
      (*local_30->_vptr_Layer[1])();
    }
    local_4 = 0;
    pMVar3 = local_508;
    pMVar4 = (Mat *)auStack_4a8;
    do {
      pMVar4 = pMVar4 + -1;
      Mat::~Mat((Mat *)0x1542ba);
    } while (pMVar4 != pMVar3);
    ParamDict::~ParamDict((ParamDict *)in_stack_fffffffffffff8f0);
    return local_4;
  }
  local_51c = in_RSI->w;
  local_520 = in_RSI->h;
  local_524 = in_RSI->c;
  local_528 = *(int *)(in_RDI + 0x8c) * (*(int *)(in_RDI + 0x84) + -1) + 1;
  local_52c = *(int *)(in_RDI + 0x90) * (*(int *)(in_RDI + 0x88) + -1) + 1;
  Mat::Mat(&local_560,in_RSI);
  left = (int)((ulong)in_stack_fffffffffffff958 >> 0x20);
  top = (int)((ulong)in_stack_fffffffffffff960 >> 0x20);
  if ((*(int *)(in_RDI + 0x9c) < 1) && (*(int *)(in_RDI + 0xa0) < 1)) {
    if ((*(int *)(in_RDI + 0x9c) == -0xe9) && (*(int *)(in_RDI + 0xa0) == -0xe9)) {
      local_568 = (local_528 +
                  ((local_51c + -1) / *(int *)(in_RDI + 0x94)) * *(int *)(in_RDI + 0x94)) -
                  local_51c;
      local_56c = (local_52c +
                  ((local_520 + -1) / *(int *)(in_RDI + 0x98)) * *(int *)(in_RDI + 0x98)) -
                  local_520;
      if ((0 < local_568) || (0 < local_56c)) {
        copy_make_border(in_stack_fffffffffffff970,in_stack_fffffffffffff968,top,
                         (int)in_stack_fffffffffffff960,left,(int)in_stack_fffffffffffff958,
                         in_stack_fffffffffffff980,in_stack_fffffffffffff954);
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
        if (bVar1) {
          local_4 = -100;
          local_564 = 1;
          goto LAB_00154c45;
        }
      }
      local_51c = local_560.w;
      local_520 = local_560.h;
    }
  }
  else {
    copy_make_border(in_stack_fffffffffffff970,in_stack_fffffffffffff968,top,
                     (int)in_stack_fffffffffffff960,left,(int)in_stack_fffffffffffff958,
                     in_stack_fffffffffffff980,in_stack_fffffffffffff954);
    bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    if (bVar1) {
      local_4 = -100;
      local_564 = 1;
      goto LAB_00154c45;
    }
    local_51c = local_560.w;
    local_520 = local_560.h;
  }
  local_570 = (local_51c - local_528) / *(int *)(in_RDI + 0x94) + 1;
  local_574 = (local_520 - local_52c) / *(int *)(in_RDI + 0x98) + 1;
  Mat::create(in_stack_fffffffffffff900,(int)(in_stack_fffffffffffff8f8 >> 0x20),
              (int)in_stack_fffffffffffff8f8,(int)((ulong)in_stack_fffffffffffff8f0 >> 0x20),
              (size_t)in_stack_fffffffffffff8e8);
  bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
  if (bVar1) {
    local_4 = -100;
    local_564 = 1;
  }
  else {
    local_578 = *(int *)(in_RDI + 0x84) * *(int *)(in_RDI + 0x88);
    std::allocator<int>::allocator((allocator<int> *)0x1546ea);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff900,
               in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    std::allocator<int>::~allocator((allocator<int> *)0x154710);
    local_5a0 = std::vector<int,_std::allocator<int>_>::operator[](&local_590,0);
    local_5a4 = 0;
    local_5a8 = 0;
    local_5ac = local_51c * *(int *)(in_RDI + 0x90) -
                *(int *)(in_RDI + 0x84) * *(int *)(in_RDI + 0x8c);
    for (local_5b0 = 0; local_5b0 < *(int *)(in_RDI + 0x88); local_5b0 = local_5b0 + 1) {
      for (local_5b4 = 0; local_5b4 < *(int *)(in_RDI + 0x84); local_5b4 = local_5b4 + 1) {
        local_5a0[local_5a4] = local_5a8;
        local_5a4 = local_5a4 + 1;
        local_5a8 = *(int *)(in_RDI + 0x8c) + local_5a8;
      }
      local_5a8 = local_5ac + local_5a8;
    }
    for (local_5b8 = 0; local_5b8 < *(int *)(in_RDI + 0x80); local_5b8 = local_5b8 + 1) {
      Mat::channel(in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e4);
      pfVar2 = Mat::operator_cast_to_float_(&local_5f0);
      Mat::~Mat((Mat *)0x1548c7);
      local_5c0 = pfVar2;
      for (local_5f4 = 0; local_5f4 < local_574; local_5f4 = local_5f4 + 1) {
        for (local_5f8 = 0; local_5f8 < local_570; local_5f8 = local_5f8 + 1) {
          local_5fc = 0.0;
          if (*(int *)(in_RDI + 0xa4) != 0) {
            pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0xe0),local_5b8);
            local_5fc = *pfVar2;
          }
          in_stack_fffffffffffff8f0 =
               (allocator_type *)Mat::operator_cast_to_float_((Mat *)(in_RDI + 0xb0));
          local_608 = in_stack_fffffffffffff8f0 + (long)(local_578 * local_524 * local_5b8) * 4;
          for (local_60c = 0; local_60c < local_524; local_60c = local_60c + 1) {
            Mat::channel(in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e4);
            in_stack_fffffffffffff8e8 =
                 (Mat *)Mat::row(&local_640,local_5f4 * *(int *)(in_RDI + 0x98));
            for (local_64c = 0; local_64c < local_578; local_64c = local_64c + 1) {
              local_5fc = *(float *)((long)&in_stack_fffffffffffff8e8->data +
                                    (long)local_5a0[local_64c] * 4 +
                                    (long)(local_5f8 * *(int *)(in_RDI + 0x94)) * 4) *
                          *(float *)(local_608 + (long)local_64c * 4) + local_5fc;
            }
            local_608 = local_608 + (long)local_578 * 4;
            Mat::~Mat((Mat *)0x154b78);
          }
          local_5c0[local_5f8] = local_5fc;
        }
        local_5c0 = local_5c0 + local_570;
      }
    }
    local_4 = 0;
    local_564 = 1;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8f0);
  }
LAB_00154c45:
  Mat::~Mat((Mat *)0x154c52);
  return local_4;
}

Assistant:

int Convolution::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    // convolv with NxN kernel
    // value = value + bias

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        int num_input = weight_data_size / num_output;
        if (bottom_blob.w == num_input)
        {
            // call InnerProduct
            ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::InnerProduct);

            // set param
            ncnn::ParamDict pd;
            pd.set(0, num_output);
            pd.set(1, bias_term);
            pd.set(2, weight_data_size);

            op->load_param(pd);

            // set weights
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            op->load_model(ModelBinFromMatArray(weights));

            // forward
            op->forward(bottom_blob, top_blob);

            delete op;

            return 0;
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;

//     fprintf(stderr, "Convolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered = bottom_blob;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for
    for (int p=0; p<num_output; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++) // 29.23
                    {
                        float val = sptr[ space_ofs[k] ]; // 20.72
                        float w = kptr[k];
                        sum += val * w; // 41.45
                    }

                    kptr += maxk;
                }

                outptr[j] = sum;
            }

            outptr += outw;
        }
    }

    return 0;
}